

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  size_t sVar1;
  ZSTD_DDict **ppZVar2;
  xxh_u64 xVar3;
  ulong uVar4;
  ulong uVar5;
  XXH_alignment in_ECX;
  size_t sVar6;
  U32 UVar7;
  ulong uVar8;
  ZSTD_DDict *pZVar9;
  U32 local_1c;
  
  if (ddict == (ZSTD_DDict *)0x0) {
    UVar7 = 0;
  }
  else {
    UVar7 = ddict->dictID;
  }
  local_1c = UVar7;
  xVar3 = XXH64_finalize(0x27d4eb2f165667c9,(xxh_u8 *)&local_1c,4,in_ECX);
  sVar1 = hashSet->ddictPtrCount;
  sVar6 = 0xffffffffffffffff;
  if (sVar1 != hashSet->ddictPtrTableSize) {
    uVar8 = hashSet->ddictPtrTableSize - 1;
    uVar4 = xVar3 & uVar8;
    ppZVar2 = hashSet->ddictPtrTable;
    pZVar9 = ppZVar2[uVar4];
    while (pZVar9 != (ZSTD_DDict *)0x0) {
      if (pZVar9->dictID == UVar7) {
        ppZVar2[uVar4] = ddict;
        goto LAB_001d77b8;
      }
      uVar5 = uVar4 & uVar8;
      uVar4 = uVar5 + 1;
      pZVar9 = ppZVar2[uVar5 + 1];
    }
    ppZVar2[uVar4] = ddict;
    hashSet->ddictPtrCount = sVar1 + 1;
LAB_001d77b8:
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}